

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor_test.cpp
# Opt level: O0

void __thiscall SetOut::test_method(SetOut *this)

{
  undefined8 uVar1;
  bool bVar2;
  pointer pCVar3;
  lazy_ostream *prev;
  string local_140;
  basic_cstring<const_char> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_110;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  undefined1 local_18 [8];
  unique_ptr<Cryptor,_std::default_delete<Cryptor>_> cryptor;
  SetOut *this_local;
  
  cryptor._M_t.super___uniq_ptr_impl<Cryptor,_std::default_delete<Cryptor>_>._M_t.
  super__Tuple_impl<0UL,_Cryptor_*,_std::default_delete<Cryptor>_>.
  super__Head_base<0UL,_Cryptor_*,_false>._M_head_impl =
       (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)
       (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"-e",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Huffman",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Test message",&local_99);
  Cryptor::cryptor_factory((Cryptor *)local_18,&local_38,&local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pCVar3 = std::unique_ptr<Cryptor,_std::default_delete<Cryptor>_>::operator->
                     ((unique_ptr<Cryptor,_std::default_delete<Cryptor>_> *)local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Test out message",&local_c1);
  Cryptor::set_out_message(pCVar3,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
               ,100);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0x22,&local_e8);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_110,prev,(char (*) [1])0x117520);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
               ,100);
    pCVar3 = std::unique_ptr<Cryptor,_std::default_delete<Cryptor>_>::operator->
                       ((unique_ptr<Cryptor,_std::default_delete<Cryptor>_> *)local_18);
    Cryptor::get_out_message_abi_cxx11_(&local_140,pCVar3);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[17]>
              (&local_110,&local_120,0x22,1,2,&local_140,"cryptor->get_out_message()",
               "Test out message","\"Test out message\"");
    std::__cxx11::string::~string((string *)&local_140);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_110);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<Cryptor,_std::default_delete<Cryptor>_>::~unique_ptr
            ((unique_ptr<Cryptor,_std::default_delete<Cryptor>_> *)local_18);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SetOut) {

  auto cryptor = Cryptor::cryptor_factory(
    "-e",
    "Huffman",
    "Test message"
  );

  cryptor->set_out_message("Test out message");

  BOOST_CHECK_EQUAL(cryptor->get_out_message(), "Test out message");
}